

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::RBPath::fixup(RBPath *this,bool expected)

{
  bool bVar1;
  reference pvVar2;
  byte in_SIL;
  array<snmalloc::RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>::RBStep,_128UL>
  *in_RDI;
  ChildRef actual;
  bool dir;
  ChildRef *curr;
  ChildRef parent;
  size_t i;
  undefined7 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffaf;
  ChildRef in_stack_ffffffffffffffb8;
  H local_38;
  byte local_29;
  reference local_28;
  uintptr_t *local_20;
  uintptr_t *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    for (local_18 = (uintptr_t *)0x1; local_18 < in_RDI[1]._M_elems[0].node.ptr.val;
        local_18 = (uintptr_t *)((long)local_18 + 1)) {
      pvVar2 = std::
               array<snmalloc::RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>::RBStep,_128UL>
               ::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      local_20 = (pvVar2->node).ptr.val;
      local_28 = std::
                 array<snmalloc::RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>::RBStep,_128UL>
                 ::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      pvVar2 = std::
               array<snmalloc::RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>::RBStep,_128UL>
               ::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffaf = pvVar2->dir & 1;
      local_29 = in_stack_ffffffffffffffaf;
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                ((ChildRef *)(CONCAT17(pvVar2->dir,in_stack_ffffffffffffffa8) & 0x1ffffffffffffff));
      local_38.val = (uintptr_t *)
                     get_dir(SUB81((ulong)in_RDI >> 0x38,0),in_stack_ffffffffffffffb8.ptr.val);
      in_stack_ffffffffffffffb8.ptr.val = (H)(local_28->node).ptr.val;
      bVar1 = ChildRef::operator!=((ChildRef *)&local_38,in_stack_ffffffffffffffb8);
      if (bVar1) {
        if ((local_9 & 1) == 0) {
          error((char *)0x1169a6);
        }
        (local_28->node).ptr.val = local_38.val;
      }
    }
  }
  return;
}

Assistant:

void fixup(bool expected = true)
      {
        if (!run_checks && !expected)
          return;

        // During a splice in remove the path can be invalidated,
        // this refreshs the path so that the it refers to the spliced
        // nodes fields.
        // TODO optimise usage to avoid traversing whole path.
        for (size_t i = 1; i < length; i++)
        {
          auto parent = path[i - 1].node;
          auto& curr = path[i].node;
          auto dir = path[i].dir;
          auto actual = get_dir(dir, parent);
          if (actual != curr)
          {
            if (!expected)
            {
              snmalloc::error("Performed an unexpected fixup.");
            }
            curr = actual;
          }
        }
      }